

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O0

void __thiscall wasm::Vacuum::doWalkFunction(Vacuum *this,Function *func)

{
  Function *func_00;
  Module *module;
  ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *this_00;
  ReFinalize local_180;
  Function *local_18;
  Function *func_local;
  Vacuum *this_local;
  
  this_00 = &(this->
             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
             ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>;
  local_18 = func;
  func_local = (Function *)this;
  Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::walk
            ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)this_00,&func->body);
  ReFinalize::ReFinalize(&local_180);
  func_00 = local_18;
  module = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                     ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)this_00);
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
            (&local_180.
              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
              .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
              super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
             func_00,module);
  ReFinalize::~ReFinalize(&local_180);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    walk(func->body);
    ReFinalize().walkFunctionInModule(func, getModule());
  }